

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t compute_best_wedge_interintra
                  (AV1_COMP *cpi,MB_MODE_INFO *mbmi,MACROBLOCKD *xd,MACROBLOCK *x,
                  int *interintra_mode_cost,BUFFER_SET *orig_dst,uint8_t *intrapred_,
                  uint8_t *tmp_buf_,int *best_mode,int *best_wedge_index,BLOCK_SIZE bsize)

{
  int64_t iVar1;
  long lVar2;
  long in_RCX;
  MACROBLOCKD *in_RDX;
  uint8_t *in_RSI;
  BUFFER_SET *in_RDI;
  long in_R8;
  int unaff_retaddr;
  BLOCK_SIZE unaff_retaddr_00;
  MACROBLOCKD *in_stack_00000008;
  int64_t total_rd;
  uint *in_stack_00000018;
  int rate_overhead;
  int64_t rd;
  byte in_stack_00000028;
  INTERINTRA_MODE mode;
  uint8_t *intrapred;
  int64_t best_total_rd;
  int64_t best_interintra_rd_wedge;
  int bw;
  AV1_COMMON *cm;
  uint8_t *in_stack_0000ffd8;
  uint8_t *in_stack_0000ffe0;
  BLOCK_SIZE in_stack_0000ffef;
  MACROBLOCK *in_stack_0000fff0;
  AV1_COMP *in_stack_0000fff8;
  byte local_59;
  long local_50;
  int64_t local_48;
  
  local_48 = 0x7fffffffffffffff;
  local_50 = 0x7fffffffffffffff;
  get_buf_by_bd(in_RDX,(uint8_t *)in_stack_00000008);
  for (local_59 = 0; local_59 < 4; local_59 = local_59 + 1) {
    in_RSI[0x40] = local_59;
    av1_build_intra_predictors_for_interintra
              ((AV1_COMMON *)total_rd,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI
               ,(int)best_interintra_rd_wedge);
    iVar1 = pick_interintra_wedge
                      (in_stack_0000fff8,in_stack_0000fff0,in_stack_0000ffef,in_stack_0000ffe0,
                       in_stack_0000ffd8);
    lVar2 = iVar1 + ((long)(*(int *)(in_R8 + (ulong)local_59 * 4) +
                           *(int *)(in_RCX + 0x8318 + (ulong)in_stack_00000028 * 0x40 +
                                   (long)(char)in_RSI[0x41] * 4)) * (long)*(int *)(in_RCX + 0x4218)
                     + 0x100 >> 9);
    if (lVar2 < local_50) {
      *in_stack_00000018 = (uint)in_RSI[0x40];
      *(int *)rd = (int)(char)in_RSI[0x41];
      local_50 = lVar2;
      local_48 = iVar1;
    }
  }
  return local_48;
}

Assistant:

static inline int64_t compute_best_wedge_interintra(
    const AV1_COMP *const cpi, MB_MODE_INFO *mbmi, MACROBLOCKD *xd,
    MACROBLOCK *const x, const int *const interintra_mode_cost,
    const BUFFER_SET *orig_dst, uint8_t *intrapred_, uint8_t *tmp_buf_,
    int *best_mode, int *best_wedge_index, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const int bw = block_size_wide[bsize];
  int64_t best_interintra_rd_wedge = INT64_MAX;
  int64_t best_total_rd = INT64_MAX;
  uint8_t *intrapred = get_buf_by_bd(xd, intrapred_);
  for (INTERINTRA_MODE mode = 0; mode < INTERINTRA_MODES; ++mode) {
    mbmi->interintra_mode = mode;
    av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                              intrapred, bw);
    int64_t rd = pick_interintra_wedge(cpi, x, bsize, intrapred_, tmp_buf_);
    const int rate_overhead =
        interintra_mode_cost[mode] +
        x->mode_costs.wedge_idx_cost[bsize][mbmi->interintra_wedge_index];
    const int64_t total_rd = rd + RDCOST(x->rdmult, rate_overhead, 0);
    if (total_rd < best_total_rd) {
      best_total_rd = total_rd;
      best_interintra_rd_wedge = rd;
      *best_mode = mbmi->interintra_mode;
      *best_wedge_index = mbmi->interintra_wedge_index;
    }
  }
  return best_interintra_rd_wedge;
}